

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_map.h
# Opt level: O2

void __thiscall
lemon::
ArrayMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_lemon::SmartDigraphBase::Arc>
::add(ArrayMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_lemon::SmartDigraphBase::Arc>
      *this,Key *key)

{
  uint uVar1;
  int iVar2;
  Notifier *pNVar3;
  Container *pCVar4;
  Value *pVVar5;
  int iVar6;
  Arc *pAVar7;
  int jd;
  uint uVar8;
  ulong uVar9;
  
  uVar1 = key->_id;
  iVar2 = this->capacity;
  if (iVar2 <= (int)uVar1) {
    pNVar3 = (this->super_ObserverBase)._notifier;
    iVar2 = iVar2 + (uint)(iVar2 == 0);
    do {
      iVar6 = iVar2;
      iVar2 = iVar6 * 2;
    } while (iVar6 <= (int)uVar1);
    pAVar7 = __gnu_cxx::new_allocator<lemon::SmartDigraphBase::Arc>::allocate
                       ((new_allocator<lemon::SmartDigraphBase::Arc> *)&this->field_0x28,(long)iVar6
                        ,(void *)0x0);
    pCVar4 = pNVar3->container;
    uVar9 = (ulong)((long)(pCVar4->super_SmartDigraphBase)._nodes.
                          super__Vector_base<lemon::SmartDigraphBase::NodeT,_std::allocator<lemon::SmartDigraphBase::NodeT>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pCVar4->super_SmartDigraphBase)._nodes.
                         super__Vector_base<lemon::SmartDigraphBase::NodeT,_std::allocator<lemon::SmartDigraphBase::NodeT>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3;
    pVVar5 = this->values;
    while( true ) {
      uVar8 = (int)uVar9 - 1;
      uVar9 = (ulong)uVar8;
      if (uVar8 == 0xffffffff) break;
      if (uVar1 != uVar8) {
        pAVar7[(int)uVar8]._id = pVVar5[(int)uVar8]._id;
      }
    }
    if ((long)this->capacity != 0) {
      operator_delete(pVVar5,(long)this->capacity << 2);
    }
    this->values = pAVar7;
    this->capacity = iVar6;
  }
  return;
}

Assistant:

virtual void build() {
    Notifier* nf = Parent::notifier();
    allocate_memory();
    Item it;
    for (nf->first(it); it != INVALID; nf->next(it)) {
      int id = nf->id(it);
      ;
      AllocatorTraits::construct(allocator, &(values[id]), Value());
    }
  }